

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O2

void Abc_RwrExpWithCut_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves,int fUseA)

{
  uint *puVar1;
  int iVar2;
  
  while( true ) {
    iVar2 = Vec_PtrFind(vLeaves,pNode);
    if (-1 < iVar2) break;
    iVar2 = Vec_PtrFind(vLeaves,(void *)((ulong)pNode ^ 1));
    if (-1 < iVar2) break;
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRewrite.c"
                    ,0x17c,"void Abc_RwrExpWithCut_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    Abc_RwrExpWithCut_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vLeaves,fUseA);
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]];
  }
  puVar1 = (uint *)(((ulong)pNode & 0xfffffffffffffffe) + 0x14);
  *puVar1 = *puVar1 | (uint)(fUseA == 0) * 0x10 + 0x10;
  return;
}

Assistant:

void Abc_RwrExpWithCut_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves, int fUseA )
{
    if ( Vec_PtrFind(vLeaves, pNode) >= 0 || Vec_PtrFind(vLeaves, Abc_ObjNot(pNode)) >= 0 )
    {
        if ( fUseA )
            Abc_ObjRegular(pNode)->fMarkA = 1;
        else
            Abc_ObjRegular(pNode)->fMarkB = 1;
        return;
    }
    assert( Abc_ObjIsNode(pNode) );
    Abc_RwrExpWithCut_rec( Abc_ObjFanin0(pNode), vLeaves, fUseA );
    Abc_RwrExpWithCut_rec( Abc_ObjFanin1(pNode), vLeaves, fUseA );
}